

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int GetCharPressed(void)

{
  int local_10;
  int local_c;
  int i;
  int value;
  
  local_c = 0;
  if (0 < CORE.Input.Keyboard.charPressedQueueCount) {
    local_c = CORE.Input.Keyboard.charPressedQueue[0];
    for (local_10 = 0; local_10 < CORE.Input.Keyboard.charPressedQueueCount + -1;
        local_10 = local_10 + 1) {
      CORE.Input.Keyboard.charPressedQueue[local_10] =
           CORE.Input.Keyboard.charPressedQueue[local_10 + 1];
    }
    CORE.Input.Keyboard.charPressedQueue[CORE.Input.Keyboard.charPressedQueueCount] = 0;
    CORE.Input.Keyboard.charPressedQueueCount = CORE.Input.Keyboard.charPressedQueueCount + -1;
  }
  return local_c;
}

Assistant:

int GetCharPressed(void)
{
    int value = 0;

    if (CORE.Input.Keyboard.charPressedQueueCount > 0)
    {
        // Get character from the queue head
        value = CORE.Input.Keyboard.charPressedQueue[0];

        // Shift elements 1 step toward the head.
        for (int i = 0; i < (CORE.Input.Keyboard.charPressedQueueCount - 1); i++)
            CORE.Input.Keyboard.charPressedQueue[i] = CORE.Input.Keyboard.charPressedQueue[i + 1];

        // Reset last character in the queue
        CORE.Input.Keyboard.charPressedQueue[CORE.Input.Keyboard.charPressedQueueCount] = 0;
        CORE.Input.Keyboard.charPressedQueueCount--;
    }

    return value;
}